

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform(connectdata *conn,_Bool *connected,_Bool *dophase_done)

{
  POP3 *pop3;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  connectdata *conn_local;
  
  if (((conn->data->set).opt_no_body & 1U) != 0) {
    *(undefined4 *)(conn->data->req).protop = 1;
  }
  *dophase_done = false;
  conn_local._4_4_ = pop3_perform_command(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    conn_local._4_4_ = pop3_multi_statemach(conn,dophase_done);
    *connected = (_Bool)((conn->bits).tcpconnect[0] & 1);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_perform(struct connectdata *conn, bool *connected,
                             bool *dophase_done)
{
  /* This is POP3 and no proxy */
  CURLcode result = CURLE_OK;
  struct POP3 *pop3 = conn->data->req.protop;

  DEBUGF(infof(conn->data, "DO phase starts\n"));

  if(conn->data->set.opt_no_body) {
    /* Requested no body means no transfer */
    pop3->transfer = FTPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* Start the first command in the DO phase */
  result = pop3_perform_command(conn);
  if(result)
    return result;

  /* Run the state-machine */
  result = pop3_multi_statemach(conn, dophase_done);

  *connected = conn->bits.tcpconnect[FIRSTSOCKET];

  if(*dophase_done)
    DEBUGF(infof(conn->data, "DO phase is complete\n"));

  return result;
}